

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
CompileFeaturesNode::Evaluate
          (string *__return_storage_ptr__,CompileFeaturesNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  GeneratorExpressionContent *__k;
  cmMakefile *this_00;
  long lVar1;
  char *pcVar2;
  cmGeneratorTarget *this_01;
  bool bVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  char *pcVar6;
  size_t sVar7;
  undefined7 extraout_var;
  long *plVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  char *__s;
  mapped_type *this_02;
  mapped_type *pmVar10;
  undefined8 uVar11;
  ulong *puVar12;
  pointer feature;
  string *feature_00;
  string error;
  string lang;
  cmGeneratorTarget *target;
  LangMap testedFeatures;
  string local_f8;
  cmGeneratorExpressionContext *local_d8;
  string local_d0;
  GeneratorExpressionContent *local_b0;
  cmGeneratorExpressionDAGChecker *local_a8;
  undefined4 local_9c;
  key_type local_98;
  string *local_78;
  cmGeneratorTarget *local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  cmGeneratorExpressionDAGChecker *local_48;
  size_t local_40;
  map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_38;
  
  local_70 = context->HeadTarget;
  local_d8 = context;
  if (local_70 == (cmGeneratorTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_68,content);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "$<COMPILE_FEATURE> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,"");
    reportError(local_d8,(string *)local_68,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    context->HadHeadSensitiveCondition = true;
    local_b0 = content;
    local_a8 = dagChecker;
    if (Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
        ::availableFeatures_abi_cxx11_ == '\0') {
      Evaluate();
    }
    local_58._8_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_58._M_allocated_capacity = 0;
    local_40 = 0;
    feature = (parameters->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_78 = __return_storage_ptr__;
    local_48 = (cmGeneratorExpressionDAGChecker *)local_58._8_8_;
    if (feature !=
        (parameters->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_allocated_capacity =
             local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        bVar3 = cmMakefile::CompileFeatureKnown
                          (local_d8->LG->Makefile,local_d8->HeadTarget->Target,feature,&local_98,
                           &local_f8);
        if (!bVar3) {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_d0,local_b0);
          reportError(local_d8,&local_d0,&local_f8);
LAB_00516844:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_005168ab;
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)local_68,&local_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pmVar4,feature);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::find(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                        ::availableFeatures_abi_cxx11_._M_t,&local_98);
        if ((_Rb_tree_header *)iVar5._M_node ==
            &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
             ::availableFeatures_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          pcVar6 = cmMakefile::CompileFeaturesAvailable(local_d8->LG->Makefile,&local_98,&local_f8);
          if (pcVar6 == (char *)0x0) {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_d0,local_b0);
            reportError(local_d8,&local_d0,&local_f8);
            __return_storage_ptr__ = local_78;
            goto LAB_00516844;
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          sVar7 = strlen(pcVar6);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar6,pcVar6 + sVar7)
          ;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::operator[](&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                 ::availableFeatures_abi_cxx11_,&local_98);
          cmSystemTools::ExpandListArgument(&local_d0,pmVar4,false);
          __return_storage_ptr__ = local_78;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        feature = feature + 1;
      } while (feature !=
               (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_a8 == (cmGeneratorExpressionDAGChecker *)0x0) {
      local_9c = 0;
    }
    else {
      bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(local_a8,(char *)0x0);
      local_9c = (undefined4)CONCAT71(extraout_var,bVar3);
    }
    if ((cmGeneratorExpressionDAGChecker *)local_58._8_8_ !=
        (cmGeneratorExpressionDAGChecker *)(local_68 + 8)) {
      local_38 = &local_d8->MaxLanguageStandard;
      uVar11 = local_58._8_8_;
      do {
        __k = (GeneratorExpressionContent *)
              ((long)&(((cmGeneratorExpressionDAGChecker *)uVar11)->Target).field_2 + 8);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                               ::availableFeatures_abi_cxx11_,(key_type *)__k);
        this_00 = local_d8->LG->Makefile;
        std::operator+(&local_98,"CMAKE_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar12 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_f8.field_2._M_allocated_capacity = *puVar12;
          local_f8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar12;
          local_f8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_f8._M_string_length = plVar8[1];
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_b0 = __k;
        pcVar6 = cmMakefile::GetDefinition(this_00,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        feature_00 = *(string **)
                      ((long)&(((cmGeneratorExpressionDAGChecker *)uVar11)->Property).field_2 + 8);
        local_a8 = (cmGeneratorExpressionDAGChecker *)uVar11;
        if (feature_00 !=
            *(string **)&(((cmGeneratorExpressionDAGChecker *)uVar11)->Seen)._M_t._M_impl) {
          do {
            _Var9 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((pmVar4->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (pmVar4->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,feature_00);
            if (_Var9._M_current ==
                (pmVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,"0","");
              goto LAB_005168ab;
            }
            if ((pcVar6 == (char *)0x0) || (*pcVar6 != '\0')) {
              bVar3 = cmMakefile::HaveStandardAvailable
                                (local_d8->LG->Makefile,local_70->Target,(string *)local_b0,
                                 feature_00);
              this_01 = local_70;
              if (!bVar3) {
                if ((char)local_9c == '\0') {
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,"0","");
                  goto LAB_005168ab;
                }
                lVar1 = *(long *)((long)&(local_a8->Target).field_2 + 8);
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,lVar1,(local_a8->Property)._M_dataplus._M_p + lVar1);
                std::__cxx11::string::append((char *)&local_f8);
                __s = cmGeneratorTarget::GetProperty(this_01,&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                if (__s == (char *)0x0) {
                  __s = pcVar6;
                }
                if (__s == (char *)0x0) {
                  __assert_fail("l",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                                ,0x563,
                                "virtual std::string CompileFeaturesNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                               );
                }
                this_02 = std::
                          map<const_cmGeneratorTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          ::operator[](local_38,&local_70);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](this_02,(key_type *)local_b0);
                pcVar2 = (char *)pmVar10->_M_string_length;
                strlen(__s);
                __return_storage_ptr__ = local_78;
                std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar2,(ulong)__s);
              }
            }
            feature_00 = feature_00 + 1;
          } while (feature_00 != *(string **)&(local_a8->Seen)._M_t._M_impl);
        }
        uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_a8);
      } while ((cmGeneratorExpressionDAGChecker *)uVar11 !=
               (cmGeneratorExpressionDAGChecker *)(local_68 + 8));
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1","");
LAB_005168ab:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* dagChecker) const
    CM_OVERRIDE
  {
    cmGeneratorTarget const* target = context->HeadTarget;
    if (!target) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<COMPILE_FEATURE> may only be used with binary targets.  It may "
        "not be used with add_custom_command or add_custom_target.");
      return std::string();
    }
    context->HadHeadSensitiveCondition = true;

    typedef std::map<std::string, std::vector<std::string> > LangMap;
    static LangMap availableFeatures;

    LangMap testedFeatures;

    for (std::vector<std::string>::const_iterator it = parameters.begin();
         it != parameters.end(); ++it) {
      std::string error;
      std::string lang;
      if (!context->LG->GetMakefile()->CompileFeatureKnown(
            context->HeadTarget->Target, *it, lang, &error)) {
        reportError(context, content->GetOriginalExpression(), error);
        return std::string();
      }
      testedFeatures[lang].push_back(*it);

      if (availableFeatures.find(lang) == availableFeatures.end()) {
        const char* featuresKnown =
          context->LG->GetMakefile()->CompileFeaturesAvailable(lang, &error);
        if (!featuresKnown) {
          reportError(context, content->GetOriginalExpression(), error);
          return std::string();
        }
        cmSystemTools::ExpandListArgument(featuresKnown,
                                          availableFeatures[lang]);
      }
    }

    bool evalLL = dagChecker && dagChecker->EvaluatingLinkLibraries();

    for (LangMap::const_iterator lit = testedFeatures.begin();
         lit != testedFeatures.end(); ++lit) {
      std::vector<std::string> const& langAvailable =
        availableFeatures[lit->first];
      const char* standardDefault = context->LG->GetMakefile()->GetDefinition(
        "CMAKE_" + lit->first + "_STANDARD_DEFAULT");
      for (std::vector<std::string>::const_iterator it = lit->second.begin();
           it != lit->second.end(); ++it) {
        if (std::find(langAvailable.begin(), langAvailable.end(), *it) ==
            langAvailable.end()) {
          return "0";
        }
        if (standardDefault && !*standardDefault) {
          // This compiler has no notion of language standard levels.
          // All features known for the language are always available.
          continue;
        }
        if (!context->LG->GetMakefile()->HaveStandardAvailable(
              target->Target, lit->first, *it)) {
          if (evalLL) {
            const char* l = target->GetProperty(lit->first + "_STANDARD");
            if (!l) {
              l = standardDefault;
            }
            assert(l);
            context->MaxLanguageStandard[target][lit->first] = l;
          } else {
            return "0";
          }
        }
      }
    }
    return "1";
  }